

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_hour
                 (year_t y,diff_t m,diff_t d,diff_t cd,diff_t hh,minute_t mm,second_t ss)

{
  undefined1 auVar1 [13];
  fields fVar2;
  hour_t hStack_40;
  minute_t mm_local;
  diff_t hh_local;
  diff_t cd_local;
  diff_t d_local;
  diff_t m_local;
  year_t y_local;
  undefined3 uStack_b;
  
  hh_local = hh / 0x18 + cd;
  _hStack_40 = hh % 0x18;
  if (_hStack_40 < 0) {
    hh_local = hh_local + -1;
    _hStack_40 = _hStack_40 + 0x18;
  }
  fVar2 = n_mon(y,m,d,hh_local,hStack_40,mm,ss);
  auVar1 = fVar2._0_13_;
  fVar2._13_3_ = uStack_b;
  fVar2.y = auVar1._0_8_;
  fVar2.m = auVar1[8];
  fVar2.d = auVar1[9];
  fVar2.hh = auVar1[10];
  fVar2.mm = auVar1[0xb];
  fVar2.ss = auVar1[0xc];
  return fVar2;
}

Assistant:

CONSTEXPR_F fields n_hour(year_t y, diff_t m, diff_t d, diff_t cd, diff_t hh,
                          minute_t mm, second_t ss) noexcept {
  cd += hh / 24;
  hh %= 24;
  if (hh < 0) {
    cd -= 1;
    hh += 24;
  }
  return n_mon(y, m, d, cd, static_cast<hour_t>(hh), mm, ss);
}